

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

double recfact(double N)

{
  double dVar1;
  
  if ((int)N == 1) {
    return 1.0;
  }
  dVar1 = recfact(N + -1.0);
  return dVar1 * N;
}

Assistant:

double recfact(double N) {
	double i;

	i = (int) N;

	if (i == 1) {
		return 1;
	} else {
		return N * recfact(N-1);
	}

}